

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator::GenerateBuilderMembers
          (ImmutablePrimitiveOneofFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutablePrimitiveOneofFieldGenerator *this_local;
  
  descriptor = FieldDescriptor::file((this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  bVar1 = SupportFieldPresence(descriptor);
  if (bVar1) {
    WriteFieldDocComment(printer,(this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
    io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $has_oneof_case_message$;\n}\n"
                      );
  }
  WriteFieldDocComment(printer,(this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    return ($boxed_type$) $oneof_name$_;\n  }\n  return $default$;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                     "$deprecation$public Builder set$capitalized_name$($type$ value) {\n$null_check$  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n  $on_changed$\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,
                     "$deprecation$public Builder clear$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n    $on_changed$\n  }\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $has_oneof_case_message$;\n"
      "}\n");
  }

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    return ($boxed_type$) $oneof_name$_;\n"
    "  }\n"
    "  return $default$;\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder set$capitalized_name$($type$ value) {\n"
    "$null_check$"
    "  $set_oneof_case_message$;\n"
    "  $oneof_name$_ = value;\n"
    "  $on_changed$\n"
    "  return this;\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder clear$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    $clear_oneof_case_message$;\n"
    "    $oneof_name$_ = null;\n"
    "    $on_changed$\n"
    "  }\n"
    "  return this;\n"
    "}\n");
}